

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

void __thiscall AActor::Tick(AActor *this)

{
  double *pdVar1;
  byte *pbVar2;
  uint8_t *puVar3;
  int *piVar4;
  ushort uVar5;
  msecnode_t *pmVar6;
  sector_t_conflict *this_00;
  player_t *ppVar7;
  ulong uVar8;
  bool bVar9;
  BYTE BVar10;
  short sVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  AInventory *pAVar15;
  AActor *pAVar16;
  PClass *pPVar17;
  DBot *pDVar18;
  long lVar19;
  sector_t_conflict *psVar20;
  SDWORD SVar21;
  FName *this_01;
  msecnode_t **ppmVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  DAngle angle;
  double dVar27;
  undefined1 auVar28 [16];
  double dVar29;
  int local_bc;
  DAngle moveangle;
  double dStack_a0;
  DVector3 pos;
  double local_70;
  double local_68;
  FName local_5c;
  FName local_58;
  FName local_54;
  undefined8 local_50;
  DVector2 local_48;
  
  if (this->state == (FState *)0x0) {
    pPVar17 = DObject::GetClass((DObject *)this);
    Printf("Actor of type %s at (%f,%f) left without a state\n",(this->__Pos).X,(this->__Pos).Y,
           FName::NameData.NameArray
           [(pPVar17->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.Index].Text);
    (*(this->super_DThinker).super_DObject._vptr_DObject[4])(this);
    return;
  }
  ClearInterpolation(this);
  uVar14 = (this->flags5).Value;
  pAVar15 = (AInventory *)this;
  if ((uVar14 >> 0x15 & 1) != 0) {
    if (((uVar14 >> 0x16 & 1) == 0) &&
       (((bglobal._16_1_ & 1) != 0 || (((byte)level.flags2 & 0x20) != 0)))) {
      if (((this->flags6).Value & 0x800000) == 0) {
        return;
      }
      this->special2 = this->special2 + 1;
      return;
    }
    bVar9 = TVector3<double>::isZero(&this->Vel);
    if ((!bVar9) || (((this->flags).Value & 0x10) == 0)) {
      _moveangle = (DVector2)ZEXT816(0);
      UnlinkFromWorld(this,(FLinkContext *)&moveangle);
      *(byte *)&(this->flags).Value = (byte)(this->flags).Value | 0x10;
      Vec3Offset(&pos,this,&this->Vel,false);
      (this->__Pos).Z = pos.Z;
      (this->__Pos).X = pos.X;
      (this->__Pos).Y = pos.Y;
      CheckPortalTransition(this,false);
      LinkToWorld(this,(FLinkContext *)&moveangle,false,(sector_t *)0x0);
    }
    goto LAB_0042b049;
  }
  while ((pAVar15 = GC::ReadBarrier<AInventory>((AInventory **)&(pAVar15->super_AActor).Inventory),
         pAVar15 != (AInventory *)0x0 &&
         (pAVar16 = GC::ReadBarrier<AActor>((AActor **)&pAVar15->Owner), pAVar16 == this))) {
    (*(pAVar15->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x27])(pAVar15);
  }
  if (((this->flags).Value & 0x10000000) != 0) {
    return;
  }
  if (((this->flags5).Value & 0x400000) == 0) {
    if (((this->flags6).Value & 0x800000) != 0) {
      this->special2 = this->special2 + 1;
    }
    if ((bglobal._16_1_ & 1) != 0) {
      if (this->player == (player_t *)0x0) {
        return;
      }
      pDVar18 = GC::ReadBarrier<DBot>((DBot **)&this->player->Bot);
      if (pDVar18 != (DBot *)0x0) {
        return;
      }
    }
    if (((byte)level.flags2 & 0x20) != 0) {
      if (this->player == (player_t *)0x0) {
        return;
      }
      if (this->player->timefreezer == 0) {
        return;
      }
    }
  }
  if ((this->effects & 1) == 0) {
    if (((this->effects & 2) != 0) &&
       (BVar10 = this->smokecounter + '\x01', this->smokecounter = BVar10, BVar10 == '\b')) {
      this->smokecounter = '\0';
      TVector3<double>::Angle((TVector3<double> *)&moveangle);
      dVar23 = fastcosdeg(moveangle.Degrees);
      dVar23 = dVar23 * this->radius;
      iVar12 = FRandom::operator()(&pr_rockettrail);
      dVar24 = fastsindeg(moveangle.Degrees);
      dVar24 = dVar24 * this->radius;
      iVar13 = FRandom::operator()(&pr_rockettrail);
      dVar25 = this->Height;
      dVar29 = (this->Vel).Z;
      this_01 = &local_58;
      FName::FName(this_01,"GrenadeSmokeTrail");
      Vec3Offset(&pos,this,(double)iVar12 * 0.015625 - (dVar23 + dVar23),
                 (double)iVar13 * 0.015625 - (dVar24 + dVar24),
                 dVar25 * 0.6666666666666666 + dVar29 * dVar25 * -0.125,false);
LAB_0042b2cf:
      pAVar16 = Spawn(this_01,&pos,ALLOW_REPLACE);
      if (pAVar16 != (AActor *)0x0) {
        uVar14 = FRandom::operator()(&pr_rockettrail);
        iVar12 = pAVar16->tics - (uVar14 & 3);
        SVar21 = 1;
        if (1 < iVar12) {
          SVar21 = iVar12;
        }
        pAVar16->tics = SVar21;
        if (((byte)cl_rockettrails.Value & 2) == 0) {
          pbVar2 = (byte *)((long)&(pAVar16->renderflags).Value + 1);
          *pbVar2 = *pbVar2 | 0x80;
        }
      }
    }
  }
  else {
    BVar10 = this->smokecounter + '\x01';
    this->smokecounter = BVar10;
    if (BVar10 == '\x04') {
      this->smokecounter = '\0';
      this_01 = &local_54;
      FName::FName(this_01,"RocketSmokeTrail");
      moveangle.Degrees = (this->Vel).X ^ 0x8000000000000000;
      dStack_a0 = (double)((ulong)(this->Vel).Y ^ 0x8000000000000000);
      Vec3Offset(&pos,this,(DVector3 *)&moveangle,false);
      goto LAB_0042b2cf;
    }
  }
  uVar14 = (this->flags4).Value;
  if (((uVar14 >> 0x17 & 1) != 0) && (0 < this->health)) {
    dVar25 = (this->Vel).Z;
    if (0.25 <= ABS(dVar25)) {
      (this->Vel).Z = dVar25 * 0.90625;
    }
    else {
      (this->Vel).Z = 0.0;
      (this->flags4).Value = uVar14 & 0xff7fffff;
    }
  }
  if ((this->effects & 0x40) == 0) {
    if (((this->flags).Value & 0x40000000) != 0) {
      puVar3 = &(this->RenderStyle).field_0.Flags;
      *puVar3 = *puVar3 & 0xfd;
      if (this->visdir < '\x01') {
        if ((this->visdir < '\0') &&
           (dVar25 = this->Alpha + -0.04285714285714286, this->Alpha = dVar25, dVar25 < 0.0)) {
          this->Alpha = 0.0;
          goto LAB_0042b4be;
        }
      }
      else {
        dVar25 = this->Alpha + 0.05714285714285714;
        this->Alpha = dVar25;
        if (1.0 < dVar25) {
          this->Alpha = 1.0;
LAB_0042b4be:
          this->visdir = '\0';
        }
      }
    }
  }
  else if (this->visdir < '\x01') {
    dVar25 = this->Alpha + -0.03125;
    this->Alpha = dVar25;
    if (dVar25 <= 0.25) {
      this->Alpha = 0.25;
      this->visdir = '\x01';
    }
  }
  else {
    dVar25 = this->Alpha + 0.03125;
    this->Alpha = dVar25;
    if (1.0 <= dVar25) {
      this->Alpha = 1.0;
      this->visdir = -1;
    }
  }
  if (((bglobal.botnum != 0) && (demoplayback == false)) &&
     ((((this->flags).Value & 0x10001) != 0 || (((this->flags3).Value & 0x2000) != 0)))) {
    FCajunMaster::BotTick(&bglobal,this);
  }
  dVar25 = 0.0;
  dVar29 = 0.0;
  if (((level.Scrolls.Count != 0) || (this->player != (player_t *)0x0)) &&
     (((this->flags).Value & 0x1008) == 0)) {
    iVar12 = 0;
    local_bc = 0;
    ppmVar22 = &this->touching_sectorlist;
    while (pmVar6 = *ppmVar22, pmVar6 != (msecnode_t *)0x0) {
      this_00 = pmVar6->m_sector;
      lVar19 = ((long)this_00 - (long)sectors) / 0x218;
      dVar23 = 0.0;
      dVar24 = 0.0;
      if ((uint)lVar19 < level.Scrolls.Count) {
        dVar23 = level.Scrolls.Array[lVar19].X;
        dVar24 = level.Scrolls.Array[lVar19].Y;
      }
      if (this->player != (player_t *)0x0) {
        uVar5 = this_00->special;
        uVar14 = (int)(short)uVar5 - 0xc9;
        if ((ushort)uVar14 < 0x18) {
          if ((i_compatflags._1_1_ & 4) == 0) {
            dVar26 = (double)((int)((uint)(ushort)((short)Tick::HexenScrollies[uVar14][0] << 8) <<
                                   0x10) >> 0x18) * 0.5;
            dVar27 = (double)(int)((long)((ulong)(byte)Tick::HexenScrollies[uVar14][1] << 0x38) >>
                                  0x38) * 0.5;
          }
          else {
            dVar26 = (double)(int)Tick::HexenCompatSpeeds[(long)Tick::HexenScrollies[uVar14][0] + 4]
                     * 0.3333333333333333;
            dVar27 = (double)(int)((long)((ulong)(byte)Tick::HexenCompatSpeeds
                                                       [(long)Tick::HexenScrollies[uVar14][1] + 4]
                                         << 0x38) >> 0x38) * 0.3333333333333333;
          }
          dVar23 = dVar23 - dVar26;
          dVar24 = dVar27 + dVar24;
        }
        else {
          uVar14 = (int)(short)uVar5 - 0xe1;
          if ((ushort)uVar14 < 0x14) {
            uVar8 = (ulong)uVar14 % 5;
            dVar26 = (double)"\x05\n\x19\x1e#"[uVar8] * 0.3333333333333333;
            if ((uVar5 < 0xe6) && ((i_compatflags._1_1_ & 4) == 0)) {
              dVar26 = (double)(((ulong)((int)uVar8 + 0xf) << 0x34) + 0x3ef0000000000000);
            }
            auVar28 = ZEXT516(CONCAT14("\x06\t\x01\x04"[(ulong)uVar14 / 5] >> 2,
                                       (uint)"\x06\t\x01\x04"[(ulong)uVar14 / 5])) & _DAT_005d2280;
            dVar23 = dVar23 + dVar26 * (double)(auVar28._0_4_ + -1);
            dVar24 = dVar24 + dVar26 * (double)(auVar28._4_4_ + -1);
          }
          else if (uVar5 == 0x76) {
            iVar13 = FTagManager::GetFirstSectorTag(&tagManager,(sector_t *)this_00);
            moveangle.Degrees = (double)((double)((iVar13 + -100) / 10) * 45.0);
            TAngle<double>::ToVector((TAngle<double> *)&pos,(double)((iVar13 + -100) % 10) / 1.5);
            dVar23 = dVar23 + pos.X;
            dVar24 = dVar24 + pos.Y;
          }
          else if (uVar5 == 0x54) {
            if ((i_compatflags._1_1_ & 4) == 0) {
              dVar23 = dVar23 + 4.0;
            }
            else {
              dVar23 = dVar23 + 9.333333333333334;
            }
          }
        }
      }
      if ((((dVar23 != 0.0) || (NAN(dVar23))) || ((dVar24 != 0.0 || (NAN(dVar24))))) &&
         ((psVar20 = sector_t::GetHeightSec(this_00), psVar20 != (sector_t_conflict *)0x0 ||
          (((this->flags).Value & 0x200) == 0)))) {
        PosRelative(&pos,this,(sector_t *)this_00);
        dStack_a0 = pos.Y;
        moveangle.Degrees = pos.X;
        dVar26 = secplane_t::ZatPoint(&this_00->floorplane,(DVector2 *)&moveangle);
        secplane_t::ZatPoint(&this_00->floorplane,this);
        if ((this->__Pos).Z <= dVar26 + 1.52587890625e-05) {
LAB_0042b8a5:
          dVar25 = dVar25 + dVar23;
          dVar29 = dVar29 + dVar24;
          local_bc = local_bc + (uint)(dVar23 != 0.0);
          iVar12 = iVar12 + (uint)(dVar24 != 0.0);
        }
        else if (psVar20 != (sector_t_conflict *)0x0) {
          dStack_a0 = pos.Y;
          moveangle.Degrees = pos.X;
          dVar27 = secplane_t::ZatPoint(&psVar20->floorplane,(DVector2 *)&moveangle);
          if ((dVar27 <= dVar26) || ((this->__Pos).Z < dVar27)) goto LAB_0042b8a5;
        }
      }
      ppmVar22 = &pmVar6->m_tnext;
    }
    if ((this->player != (player_t *)0x0) || ((i_compatflags._1_1_ & 0x80) == 0)) {
      if (1 < local_bc) {
        dVar25 = dVar25 / (double)local_bc;
      }
      if (1 < iVar12) {
        dVar29 = dVar29 / (double)iVar12;
      }
    }
  }
  if ((((this->flags).Value & 0x1212) == 2) && ((this->Vel).Z <= 0.0)) {
    pdVar1 = &(this->__Pos).Z;
    if ((this->floorz == *pdVar1) && (!NAN(this->floorz) && !NAN(*pdVar1))) {
      moveangle.Degrees = (this->__Pos).X;
      dStack_a0 = (this->__Pos).Y;
      P_FindFloorPlane((secplane_t *)&pos,(sector_t_conflict *)this->floorsector,
                       (DVector3 *)&moveangle);
      dVar24 = pos.Y;
      dVar23 = pos.X;
      if ((pos.Z < 0.707122802734375) &&
         (PosRelative(&pos,this,this->floorsector),
         (pos.Y * dVar24 + local_70 + pos.X * dVar23) * local_68 <= this->floorz)) {
        if (0.4714152018229167 < pos.Z) {
          ppmVar22 = &this->touching_sectorlist;
          while (pmVar6 = *ppmVar22, pmVar6 != (msecnode_t *)0x0) {
            if ((0.707122802734375 <= (pmVar6->m_sector->floorplane).normal.Z) &&
               (PosRelative(&pos,this,(sector_t *)pmVar6->m_sector),
               (this->__Pos).Z - this->MaxStepHeight <=
               (pos.Y * dVar24 + local_70 + pos.X * dVar23) * local_68)) goto LAB_0042bbcd;
            ppmVar22 = &pmVar6->m_tnext;
          }
        }
        (this->Vel).X = dVar23 + (this->Vel).X;
        (this->Vel).Y = dVar24 + (this->Vel).Y;
      }
    }
  }
LAB_0042bbcd:
  if (((((((this->flags).Value & 0x10000) != 0) && (dVar23 = (this->Vel).X, dVar23 == 0.0)) &&
       (!NAN(dVar23))) && ((dVar23 = (this->Vel).Y, dVar23 == 0.0 && (!NAN(dVar23))))) &&
     ((this->DamageVal != 0 || (this->DamageFunc != (VMFunction *)0x0)))) {
    (this->Vel).X = 1.52587890625e-05;
  }
  this->BlockingMobj = (AActor *)0x0;
  local_48.X = dVar25;
  local_48.Y = dVar29;
  dVar25 = P_XYMovement(this,&local_48);
  if (((this->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    return;
  }
  dVar29 = (this->Vel).X;
  if (((dVar29 == 0.0) && (!NAN(dVar29))) &&
     ((dVar29 = (this->Vel).Y, dVar29 == 0.0 && (!NAN(dVar29))))) {
    uVar14 = (this->flags2).Value;
    if ((uVar14 & 8) != 0) {
      (this->flags2).Value = uVar14 & 0xfffffff7;
    }
    uVar14 = (this->flags6).Value;
    if (((uVar14 >> 9 & 1) != 0) && ((this->health < 1 || (this->SeeState == (FState *)0x0)))) {
      (this->flags6).Value = uVar14 | 0x2000;
    }
  }
  dVar29 = (this->Vel).Z;
  if (((dVar29 != 0.0) || (NAN(dVar29))) || (this->BlockingMobj != (AActor *)0x0)) {
LAB_0042bc94:
    if (((((this->flags2).Value & 0x1000) == 0) && (((this->flags).Value & 1) == 0)) ||
       (((byte)i_compatflags & 0x10) != 0)) {
      P_ZMovement(this,dVar25);
    }
    else {
      pAVar16 = P_CheckOnmobj(this);
      if (pAVar16 == (AActor *)0x0) {
        P_ZMovement(this,dVar25);
        pbVar2 = (byte *)((long)&(this->flags2).Value + 1);
        *pbVar2 = *pbVar2 & 0xf7;
      }
      else {
        if (((this->player != (player_t *)0x0) &&
            (dVar25 = level.gravity * this->Sector->gravity * -0.01, pdVar1 = &(this->Vel).Z,
            *pdVar1 <= dVar25 && dVar25 != *pdVar1)) && (((this->flags).Value & 0x200) == 0)) {
          PlayerLandedOnThing(this,pAVar16);
        }
        dVar25 = (pAVar16->__Pos).Z + pAVar16->Height;
        dVar29 = dVar25 - (this->__Pos).Z;
        if (dVar29 <= this->MaxStepHeight) {
          ppVar7 = this->player;
          if ((ppVar7 != (player_t *)0x0) && (ppVar7->mo == (APlayerPawn *)this)) {
            dVar29 = ppVar7->viewheight - dVar29;
            ppVar7->viewheight = dVar29;
            dVar29 = ((ppVar7->mo->ViewHeight + ppVar7->crouchviewdelta) - dVar29) * 0.125;
            if (ppVar7->deltaviewheight <= dVar29 && dVar29 != ppVar7->deltaviewheight) {
              ppVar7->deltaviewheight = dVar29;
            }
          }
          (this->__Pos).Z = dVar25;
        }
        if (((pAVar16->flags6).Value & 0x20) != 0) {
          if (this->player == (player_t *)0x0) {
            if (((((pAVar16->activationtype & 8U) != 0) && (((this->flags3).Value & 0x2000) != 0))
                || (((pAVar16->activationtype & 0x10U) != 0 &&
                    (((this->flags).Value & 0x10000) != 0)))) && (pAVar16->lastbump < level.maptime)
               ) goto LAB_0042be8a;
          }
          else if ((pAVar16->lastbump < level.maptime) && ((this->player->cheats & 0x2000) == 0)) {
LAB_0042be8a:
            bVar9 = P_ActivateThingSpecial(pAVar16,this,false);
            if (bVar9) {
              pAVar16->lastbump = level.maptime + 0x23;
            }
          }
        }
        dVar25 = (this->Vel).Z;
        if (((dVar25 == 0.0) && (!NAN(dVar25))) || (((this->BounceFlags).Value & 8) == 0)) {
          pbVar2 = (byte *)((long)&(this->flags2).Value + 1);
          *pbVar2 = *pbVar2 | 8;
          (this->Vel).Z = 0.0;
          goto LAB_0042beda;
        }
        P_BounceActor(this,pAVar16,true);
      }
    }
LAB_0042bef2:
    if (((this->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      return;
    }
  }
  else {
    dVar29 = (this->__Pos).Z;
    dVar23 = this->floorz;
    if ((dVar29 != dVar23) || (NAN(dVar29) || NAN(dVar23))) goto LAB_0042bc94;
    if (dVar29 <= dVar23) {
LAB_0042beda:
      Crash(this);
      goto LAB_0042bef2;
    }
  }
  CheckPortalTransition(this,true);
  (*(this->super_DThinker).super_DObject._vptr_DObject[0x19])(this,1);
  if ((this->player != (player_t *)0x0) && ((this->player->cheats & 0x2000) != 0)) {
    return;
  }
  if (this->PoisonDurationReceived != 0) {
    iVar12 = 0x23;
    if (this->PoisonPeriodReceived != 0) {
      iVar12 = this->PoisonPeriodReceived;
    }
    if (level.time % iVar12 == 0) {
      pAVar16 = GC::ReadBarrier<AActor>((AActor **)&this->Poisoner);
      iVar12 = (this->PoisonDamageTypeReceived).super_FName.Index;
      local_5c.Index = 0xc6;
      if (iVar12 != 0) {
        local_5c.Index = iVar12;
      }
      local_50 = 0;
      P_DamageMobj(this,(AActor *)0x0,pAVar16,this->PoisonDamageReceived,&local_5c,0,angle);
      piVar4 = &this->PoisonDurationReceived;
      *piVar4 = *piVar4 + -1;
      if (*piVar4 == 0) {
        this->PoisonDamageReceived = 0;
      }
    }
  }
LAB_0042b049:
  if (this->state != (FState *)0x0) {
    bVar9 = CheckNoDelay(this);
    if (bVar9) {
      UpdateRenderSectorList(this);
      iVar12 = this->tics;
      if (iVar12 == -1) {
        iVar12 = G_SkillProperty(SKILLP_Respawn);
        uVar14 = (this->flags5).Value;
        if (((((uVar14 >> 0x11 & 1) != 0) ||
             (((iVar12 != 0 && (((this->flags3).Value & 0x2000) != 0)) &&
              (((uVar14 & 0x40000) == 0 && ((this->flags2).Value & 0x10000000) == 0 &&
               ((iVar13 = G_SkillProperty(SKILLP_RespawnLimit), iVar13 < 1 ||
                (this->skillrespawncount < iVar13)))))))) &&
            (sVar11 = this->movecount + 1, this->movecount = sVar11, iVar12 <= sVar11)) &&
           (((level.time & 0x1fU) == 0 &&
            (iVar12 = FRandom::operator()(&pr_nightmarerespawn), iVar12 < 5)))) {
          P_NightmareRespawn(this);
        }
      }
      else {
        this->tics = iVar12 + -1;
        if (iVar12 < 2) {
          SetState(this,this->state->NextState,false);
        }
      }
    }
    return;
  }
  __assert_fail("state != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1093,"virtual void AActor::Tick()");
}

Assistant:

void AActor::Tick ()
{
	// [RH] Data for Heretic/Hexen scrolling sectors
	static const SBYTE HexenCompatSpeeds[] = {-25, 0, -10, -5, 0, 5, 10, 0, 25 };
	static const SBYTE HexenScrollies[24][2] =
	{
		{  0,  1 }, {  0,  2 }, {  0,  4 },
		{ -1,  0 }, { -2,  0 }, { -4,  0 },
		{  0, -1 }, {  0, -2 }, {  0, -4 },
		{  1,  0 }, {  2,  0 }, {  4,  0 },
		{  1,  1 }, {  2,  2 }, {  4,  4 },
		{ -1,  1 }, { -2,  2 }, { -4,  4 },
		{ -1, -1 }, { -2, -2 }, { -4, -4 },
		{  1, -1 }, {  2, -2 }, {  4, -4 }
	};

	static const BYTE HereticScrollDirs[4] = { 6, 9, 1, 4 };
	static const BYTE HereticSpeedMuls[5] = { 5, 10, 25, 30, 35 };


	AActor *onmo;

	//assert (state != NULL);
	if (state == NULL)
	{
		Printf("Actor of type %s at (%f,%f) left without a state\n", GetClass()->TypeName.GetChars(), X(), Y());
		Destroy();
		return;
	}

	// This is necessary to properly interpolate movement outside this function
	// like from an ActorMover
	ClearInterpolation();

	if (flags5 & MF5_NOINTERACTION)
	{
		// only do the minimally necessary things here to save time:
		// Check the time freezer
		// apply velocity
		// ensure that the actor is not linked into the blockmap

		if (!(flags5 & MF5_NOTIMEFREEZE))
		{
			//Added by MC: Freeze mode.
			if (bglobal.freeze || level.flags2 & LEVEL2_FROZEN)
			{
				// Boss cubes shouldn't be accelerated by timefreeze
				if (flags6 & MF6_BOSSCUBE)
				{
					special2++;
				}
				return;
			}
		}

		if (!Vel.isZero() || !(flags & MF_NOBLOCKMAP))
		{
			FLinkContext ctx;
			UnlinkFromWorld(&ctx);
			flags |= MF_NOBLOCKMAP;
			SetXYZ(Vec3Offset(Vel));
			CheckPortalTransition(false);
			LinkToWorld(&ctx);
		}
	}
	else
	{
		AInventory * item = Inventory;

		// Handle powerup effects here so that the order is controlled
		// by the order in the inventory, not the order in the thinker table
		while (item != NULL && item->Owner == this)
		{
			item->DoEffect();
			item = item->Inventory;
		}

		if (flags & MF_UNMORPHED)
		{
			return;
		}

		if (!(flags5 & MF5_NOTIMEFREEZE))
		{
			// Boss cubes shouldn't be accelerated by timefreeze
			if (flags6 & MF6_BOSSCUBE)
			{
				special2++;
			}
			//Added by MC: Freeze mode.
			if (bglobal.freeze && !(player && player->Bot == NULL))
			{
				return;
			}

			// Apply freeze mode.
			if ((level.flags2 & LEVEL2_FROZEN) && (player == NULL || player->timefreezer == 0))
			{
				return;
			}
		}


		if (effects & FX_ROCKET) 
		{
			if (++smokecounter == 4)
			{
				// add some smoke behind the rocket 
				smokecounter = 0;
				AActor *th = Spawn("RocketSmokeTrail", Vec3Offset(-Vel), ALLOW_REPLACE);
				if (th)
				{
					th->tics -= pr_rockettrail()&3;
					if (th->tics < 1) th->tics = 1;
					if (!(cl_rockettrails & 2)) th->renderflags |= RF_INVISIBLE;
				}
			}
		}
		else if (effects & FX_GRENADE) 
		{
			if (++smokecounter == 8)
			{
				smokecounter = 0;
				DAngle moveangle = Vel.Angle();
				double xo = -moveangle.Cos() * radius * 2 + pr_rockettrail() / 64.;
				double yo = -moveangle.Sin() * radius * 2 + pr_rockettrail() / 64.;
				double zo = -Height * Vel.Z / 8. + Height * (2 / 3.);
				AActor * th = Spawn("GrenadeSmokeTrail", Vec3Offset(xo, yo, zo), ALLOW_REPLACE);
				if (th)
				{
					th->tics -= pr_rockettrail()&3;
					if (th->tics < 1) th->tics = 1;
					if (!(cl_rockettrails & 2)) th->renderflags |= RF_INVISIBLE;
				}
			}
		}

		double oldz = Z();

		// [RH] Give the pain elemental vertical friction
		// This used to be in APainElemental::Tick but in order to use
		// A_PainAttack with other monsters it has to be here
		if (flags4 & MF4_VFRICTION)
		{
			if (health >0)
			{
				if (fabs (Vel.Z) < 0.25)
				{
					Vel.Z = 0;
					flags4 &= ~MF4_VFRICTION;
				}
				else
				{
					Vel.Z *= (0xe800 / 65536.);
				}
			}
		}

		// [RH] Pulse in and out of visibility
		if (effects & FX_VISIBILITYPULSE)
		{
			if (visdir > 0)
			{
				Alpha += 1/32.;
				if (Alpha >= 1.)
				{
					Alpha = 1.;
					visdir = -1;
				}
			}
			else
			{
				Alpha -= 1/32.;
				if (Alpha <= 0.25)
				{
					Alpha = 0.25;
					visdir = 1;
				}
			}
		}
		else if (flags & MF_STEALTH)
		{
			// [RH] Fade a stealth monster in and out of visibility
			RenderStyle.Flags &= ~STYLEF_Alpha1;
			if (visdir > 0)
			{
				Alpha += 2./TICRATE;
				if (Alpha > 1.)
				{
					Alpha = 1.;
					visdir = 0;
				}
			}
			else if (visdir < 0)
			{
				Alpha -= 1.5/TICRATE;
				if (Alpha < 0)
				{
					Alpha = 0;
					visdir = 0;
				}
			}
		}

		if (bglobal.botnum && !demoplayback &&
			((flags & (MF_SPECIAL|MF_MISSILE)) || (flags3 & MF3_ISMONSTER)))
		{
			bglobal.BotTick(this);
		}

		// [RH] Consider carrying sectors here
		DVector2 cumm(0, 0);
		if ((level.Scrolls.Size() != 0 || player != NULL) && !(flags & MF_NOCLIP) && !(flags & MF_NOSECTOR))
		{
			double height, waterheight;	// killough 4/4/98: add waterheight
			const msecnode_t *node;
			int countx, county;

			// killough 3/7/98: Carry things on floor
			// killough 3/20/98: use new sector list which reflects true members
			// killough 3/27/98: fix carrier bug
			// killough 4/4/98: Underwater, carry things even w/o gravity

			// Move objects only if on floor or underwater,
			// non-floating, and clipped.

			countx = county = 0;

			for (node = touching_sectorlist; node; node = node->m_tnext)
			{
				sector_t *sec = node->m_sector;
				DVector2 scrollv;

				if (level.Scrolls.Size() > unsigned(sec-sectors))
				{
					scrollv = level.Scrolls[sec - sectors];
				}
				else
				{
					scrollv.Zero();
				}

				if (player != NULL)
				{
					int scrolltype = sec->special;

					if (scrolltype >= Scroll_North_Slow &&
						scrolltype <= Scroll_SouthWest_Fast)
					{ // Hexen scroll special
						scrolltype -= Scroll_North_Slow;
						if (i_compatflags&COMPATF_RAVENSCROLL)
						{
							scrollv.X -= HexenCompatSpeeds[HexenScrollies[scrolltype][0]+4] * (1. / (32 * CARRYFACTOR));
							scrollv.Y += HexenCompatSpeeds[HexenScrollies[scrolltype][1]+4] * (1. / (32 * CARRYFACTOR));

						}
						else
						{
							// Use speeds that actually match the scrolling textures!
							scrollv.X -= HexenScrollies[scrolltype][0] * 0.5;
							scrollv.Y += HexenScrollies[scrolltype][1] * 0.5;
						}
					}
					else if (scrolltype >= Carry_East5 &&
							 scrolltype <= Carry_West35)
					{ // Heretic scroll special
						scrolltype -= Carry_East5;
						BYTE dir = HereticScrollDirs[scrolltype / 5];
						double carryspeed = HereticSpeedMuls[scrolltype % 5] * (1. / (32 * CARRYFACTOR));
						if (scrolltype < 5 && !(i_compatflags&COMPATF_RAVENSCROLL)) 
						{
							// Use speeds that actually match the scrolling textures!
							carryspeed = (1 << ((scrolltype % 5) + 15)) / 65536.;
						}
						scrollv.X += carryspeed * ((dir & 3) - 1);
						scrollv.Y += carryspeed * (((dir & 12) >> 2) - 1);
					}
					else if (scrolltype == dScroll_EastLavaDamage)
					{ // Special Heretic scroll special
						if (i_compatflags&COMPATF_RAVENSCROLL)
						{
							scrollv.X += 28. / (32*CARRYFACTOR);
						}
						else
						{
							// Use a speed that actually matches the scrolling texture!
							scrollv.X += 12. / (32 * CARRYFACTOR);
						}
					}
					else if (scrolltype == Scroll_StrifeCurrent)
					{ // Strife scroll special
						int anglespeed = tagManager.GetFirstSectorTag(sec) - 100;
						double carryspeed = (anglespeed % 10) / (16 * CARRYFACTOR);
						DAngle angle = ((anglespeed / 10) * 45.);
						scrollv += angle.ToVector(carryspeed);
					}
				}

				if (scrollv.isZero())
				{
					continue;
				}
				sector_t *heightsec = sec->GetHeightSec();
				if (flags & MF_NOGRAVITY && heightsec == NULL)
				{
					continue;
				}
				DVector3 pos = PosRelative(sec);
				height = sec->floorplane.ZatPoint (pos);
				double height2 = sec->floorplane.ZatPoint(this);
				if (isAbove(height))
				{
					if (heightsec == NULL)
					{
						continue;
					}

					waterheight = heightsec->floorplane.ZatPoint (pos);
					if (waterheight > height && Z() >= waterheight)
					{
						continue;
					}
				}

				cumm += scrollv;
				if (scrollv.X) countx++;
				if (scrollv.Y) county++;
			}

			// Some levels designed with Boom in mind actually want things to accelerate
			// at neighboring scrolling sector boundaries. But it is only important for
			// non-player objects.
			if (player != NULL || !(i_compatflags & COMPATF_BOOMSCROLL))
			{
				if (countx > 1)
				{
					cumm.X /= countx;
				}
				if (county > 1)
				{
					cumm.Y /= county;
				}
			}
		}

		// [RH] If standing on a steep slope, fall down it
		if ((flags & MF_SOLID) && !(flags & (MF_NOCLIP|MF_NOGRAVITY)) &&
			!(flags & MF_NOBLOCKMAP) &&
			Vel.Z <= 0 &&
			floorz == Z())
		{
			secplane_t floorplane;

			// Check 3D floors as well
			floorplane = P_FindFloorPlane(floorsector, PosAtZ(floorz));

			if (floorplane.fC() < STEEPSLOPE &&
				floorplane.ZatPoint (PosRelative(floorsector)) <= floorz)
			{
				const msecnode_t *node;
				bool dopush = true;

				if (floorplane.fC() > STEEPSLOPE*2/3)
				{
					for (node = touching_sectorlist; node; node = node->m_tnext)
					{
						const sector_t *sec = node->m_sector;
						if (sec->floorplane.fC() >= STEEPSLOPE)
						{
							if (floorplane.ZatPoint(PosRelative(node->m_sector)) >= Z() - MaxStepHeight)
							{
								dopush = false;
								break;
							}
						}
					}
				}
				if (dopush)
				{
					Vel += floorplane.Normal().XY();
				}
			}
		}

		// [RH] Missiles moving perfectly vertical need some X/Y movement, or they
		// won't hurt anything. Don't do this if damage is 0! That way, you can
		// still have missiles that go straight up and down through actors without
		// damaging anything.
		// (for backwards compatibility this must check for lack of damage function, not for zero damage!)
		if ((flags & MF_MISSILE) && Vel.X == 0 && Vel.Y == 0 && !IsZeroDamage())
		{
			Vel.X = MinVel;
		}

		// Handle X and Y velocities
		BlockingMobj = NULL;
		double oldfloorz = P_XYMovement (this, cumm);
		if (ObjectFlags & OF_EuthanizeMe)
		{ // actor was destroyed
			return;
		}
		if (Vel.X == 0 && Vel.Y == 0) // Actors at rest
		{
			if (flags2 & MF2_BLASTED)
			{ // Reset to not blasted when velocities are gone
				flags2 &= ~MF2_BLASTED;
			}
			if ((flags6 & MF6_TOUCHY) && !IsSentient())
			{ // Arm a mine which has come to rest
				flags6 |= MF6_ARMED;
			}

		}
		if (Vel.Z != 0 || BlockingMobj || Z() != floorz)
		{	// Handle Z velocity and gravity
			if (((flags2 & MF2_PASSMOBJ) || (flags & MF_SPECIAL)) && !(i_compatflags & COMPATF_NO_PASSMOBJ))
			{
				if (!(onmo = P_CheckOnmobj (this)))
				{
					P_ZMovement (this, oldfloorz);
					flags2 &= ~MF2_ONMOBJ;
				}
				else
				{
					if (player)
					{
						if (Vel.Z < level.gravity * Sector->gravity * (-1./100)// -655.36f)
							&& !(flags&MF_NOGRAVITY))
						{
							PlayerLandedOnThing (this, onmo);
						}
					}
					if (onmo->Top() - Z() <= MaxStepHeight)
					{
						if (player && player->mo == this)
						{
							player->viewheight -= onmo->Top() - Z();
							double deltaview = player->GetDeltaViewHeight();
							if (deltaview > player->deltaviewheight)
							{
								player->deltaviewheight = deltaview;
							}
						} 
						SetZ(onmo->Top());
					}
					// Check for MF6_BUMPSPECIAL
					// By default, only players can activate things by bumping into them
					// We trigger specials as long as we are on top of it and not just when
					// we land on it. This could be considered as gravity making us continually
					// bump into it, but it also avoids having to worry about walking on to
					// something without dropping and not triggering anything.
					if ((onmo->flags6 & MF6_BUMPSPECIAL) && ((player != NULL)
						|| ((onmo->activationtype & THINGSPEC_MonsterTrigger) && (flags3 & MF3_ISMONSTER))
						|| ((onmo->activationtype & THINGSPEC_MissileTrigger) && (flags & MF_MISSILE))
						) && (level.maptime > onmo->lastbump)) // Leave the bumper enough time to go away
					{
						if (player == NULL || !(player->cheats & CF_PREDICTING))
						{
							if (P_ActivateThingSpecial(onmo, this))
								onmo->lastbump = level.maptime + TICRATE;
						}
					}
					if (Vel.Z != 0 && (BounceFlags & BOUNCE_Actors))
					{
						P_BounceActor(this, onmo, true);
					}
					else
					{
						flags2 |= MF2_ONMOBJ;
						Vel.Z = 0;
						Crash();
					}
				}
			}
			else
			{
				P_ZMovement (this, oldfloorz);
			}

			if (ObjectFlags & OF_EuthanizeMe)
				return;		// actor was destroyed
		}
		else if (Z() <= floorz)
		{
			Crash();
			if (ObjectFlags & OF_EuthanizeMe)
				return;		// actor was destroyed
		}

		CheckPortalTransition(true);

		UpdateWaterLevel ();

		// [RH] Don't advance if predicting a player
		if (player && (player->cheats & CF_PREDICTING))
		{
			return;
		}

		// Check for poison damage, but only once per PoisonPeriod tics (or once per second if none).
		if (PoisonDurationReceived && (level.time % (PoisonPeriodReceived ? PoisonPeriodReceived : TICRATE) == 0))
		{
			P_DamageMobj(this, NULL, Poisoner, PoisonDamageReceived, PoisonDamageTypeReceived ? PoisonDamageTypeReceived : (FName)NAME_Poison, 0);

			--PoisonDurationReceived;

			// Must clear damage when duration is done, otherwise it
			// could be added to with ADDITIVEPOISONDAMAGE.
			if (!PoisonDurationReceived) PoisonDamageReceived = 0;
		}
	}

	assert (state != NULL);
	if (state == NULL)
	{
		Destroy();
		return;
	}
	if (!CheckNoDelay())
		return; // freed itself
	// cycle through states, calling action functions at transitions

	UpdateRenderSectorList();

	if (tics != -1)
	{
		// [RH] Use tics <= 0 instead of == 0 so that spawnstates
		// of 0 tics work as expected.
		if (--tics <= 0)
		{
			if (!SetState(state->GetNextState()))
				return; 		// freed itself
		}
	}
	else
	{
		int respawn_monsters = G_SkillProperty(SKILLP_Respawn);
		// check for nightmare respawn
		if (!(flags5 & MF5_ALWAYSRESPAWN))
		{
			if (!respawn_monsters || !(flags3 & MF3_ISMONSTER) || (flags2 & MF2_DORMANT) || (flags5 & MF5_NEVERRESPAWN))
				return;

			int limit = G_SkillProperty (SKILLP_RespawnLimit);
			if (limit > 0 && skillrespawncount >= limit)
				return;
		}

		movecount++;

		if (movecount < respawn_monsters)
			return;

		if (level.time & 31)
			return;

		if (pr_nightmarerespawn() > 4)
			return;

		P_NightmareRespawn (this);
	}
}